

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O2

iterator __thiscall
CP::list<CP::list<int>_>::insert(list<CP::list<int>_> *this,iterator it,list<int> *element)

{
  node *pnVar1;
  node *this_00;
  
  this_00 = (node *)operator_new(0x20);
  pnVar1 = (it.ptr)->prev;
  list<int>::list((list<int> *)this_00,element);
  this_00->prev = pnVar1;
  this_00->next = it.ptr;
  (it.ptr)->prev->next = this_00;
  (it.ptr)->prev = this_00;
  this->mSize = this->mSize + 1;
  return (iterator)this_00;
}

Assistant:

iterator insert(iterator it,const T& element) {
      node *n = new node(element,it.ptr->prev, it.ptr);
      it.ptr->prev->next = n;
      it.ptr->prev = n;
      mSize++;
      return iterator(n);
    }